

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O3

void __thiscall
OpenMD::LessThanOrEqualToConstraint<double>::LessThanOrEqualToConstraint
          (LessThanOrEqualToConstraint<double> *this,double rhs)

{
  stringstream iss;
  long *local_1c0 [2];
  long local_1b0 [2];
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  (this->super_ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_>).description_.
  _M_dataplus._M_p =
       (pointer)&(this->super_ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_>).
                 description_.field_2;
  (this->super_ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_>).description_.
  _M_string_length = 0;
  (this->super_ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<double>_>).description_.
  field_2._M_local_buf[0] = '\0';
  this->rhs_ = rhs;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"less than or equal to",0x15);
  std::ostream::_M_insert<double>(rhs);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)this,(string *)local_1c0);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],local_1b0[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

LessThanOrEqualToConstraint(T rhs) : rhs_(rhs) {
      std::stringstream iss;
      iss << "less than or equal to" << rhs;
      this->description_ = iss.str();
    }